

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O3

GLFWvkproc glfwGetInstanceProcAddress(VkInstance instance,char *procname)

{
  GLFWbool GVar1;
  PFN_vkVoidFunction p_Var2;
  GLFWvkproc p_Var3;
  
  if (procname == (char *)0x0) {
    __assert_fail("procname != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/glfw/src/vulkan.c"
                  ,0xfa,"GLFWvkproc glfwGetInstanceProcAddress(VkInstance, const char *)");
  }
  if (_glfw.initialized == 0) {
    p_Var2 = (PFN_vkVoidFunction)0x0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    GVar1 = _glfwInitVulkan(2);
    if (GVar1 == 0) {
      p_Var2 = (PFN_vkVoidFunction)0x0;
    }
    else {
      p_Var2 = (*_glfw.vk.GetInstanceProcAddr)(instance,procname);
      if (p_Var2 == (PFN_vkVoidFunction)0x0) {
        p_Var3 = (GLFWvkproc)dlsym(_glfw.vk.handle,procname);
        return p_Var3;
      }
    }
  }
  return p_Var2;
}

Assistant:

GLFWAPI GLFWvkproc glfwGetInstanceProcAddress(VkInstance instance,
                                              const char* procname)
{
    GLFWvkproc proc;
    assert(procname != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!_glfwInitVulkan(_GLFW_REQUIRE_LOADER))
        return NULL;

    proc = (GLFWvkproc) vkGetInstanceProcAddr(instance, procname);
#if defined(_GLFW_VULKAN_STATIC)
    if (!proc)
    {
        if (strcmp(procname, "vkGetInstanceProcAddr") == 0)
            return (GLFWvkproc) vkGetInstanceProcAddr;
    }
#else
    if (!proc)
        proc = (GLFWvkproc) _glfw_dlsym(_glfw.vk.handle, procname);
#endif

    return proc;
}